

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::StartGroup(JunitReporter *this,string *groupName)

{
  Stats SStack_78;
  
  Stats::Stats(&SStack_78,groupName);
  std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::
  emplace_back<Catch::JunitReporter::Stats>(&this->m_statsForSuites,&SStack_78);
  Stats::~Stats(&SStack_78);
  this->m_currentStats =
       (this->m_statsForSuites).
       super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  return;
}

Assistant:

virtual void StartGroup( const std::string& groupName ) {
            m_statsForSuites.push_back( Stats( groupName ) );
            m_currentStats = &m_statsForSuites.back();
        }